

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O1

int_t zLUMemInit(fact_t fact,void *work,int_t lwork,int m,int n,int_t annz,int panel_size,
                double fill_ratio,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,int **iwork,
                doublecomplex **dwork)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ExpHeader *pEVar4;
  void *pvVar5;
  void *pvVar6;
  int_t *piVar7;
  int_t *addr;
  int iVar8;
  int_t iVar9;
  uint uVar10;
  ulong uVar11;
  int n_00;
  int_t nzlumax;
  int_t nzlmax;
  int local_17c;
  int local_178;
  int local_174;
  int *local_170;
  int_t *local_168;
  int_t local_15c;
  int_t *local_158;
  int_t *local_150;
  int *local_148;
  ulong local_140;
  int local_138 [66];
  
  uVar11 = (ulong)(uint)n;
  Glu->n = n;
  Glu->num_expansions = 0;
  local_174 = m;
  local_170 = (int *)fill_ratio;
  local_15c = annz;
  pEVar4 = (ExpHeader *)superlu_malloc(0x60);
  Glu->expanders = pEVar4;
  if (pEVar4 == (ExpHeader *)0x0) {
    sprintf((char *)local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for expanders",0xd4
            ,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zmemory.c");
    superlu_abort_and_exit((char *)local_138);
  }
  local_140 = uVar11;
  if (fact == SamePattern_SameRowPerm) {
    pvVar5 = L->Store;
    pvVar6 = U->Store;
    local_170 = *(int **)((long)pvVar5 + 0x30);
    local_148 = *(int **)((long)pvVar5 + 0x28);
    local_158 = *(int_t **)((long)pvVar5 + 0x10);
    local_150 = *(int_t **)((long)pvVar5 + 0x20);
    local_168 = *(int_t **)((long)pvVar6 + 0x18);
    local_138[0] = Glu->nzlmax;
    local_178 = Glu->nzumax;
    local_17c = Glu->nzlumax;
    if (lwork == 0) {
      Glu->MemModel = SYSTEM;
    }
    else {
      if (lwork == -1) {
        return ((panel_size + 1) * local_174 + local_178 + local_17c) * 0x10 +
               n * 0x15 + (local_138[0] + (panel_size * 2 + 7) * local_174 + local_178) * 4 + 0x14;
      }
      uVar10 = lwork + 3;
      if (-1 < lwork) {
        uVar10 = lwork;
      }
      Glu->MemModel = USER;
      (Glu->stack).top2 = uVar10 & 0xfffffffc;
      (Glu->stack).size = uVar10 & 0xfffffffc;
    }
    piVar7 = *(int_t **)((long)pvVar5 + 0x18);
    pEVar4 = Glu->expanders;
    pEVar4[2].mem = piVar7;
    pvVar5 = *(void **)((long)pvVar5 + 8);
    pEVar4->mem = pvVar5;
    addr = *(int_t **)((long)pvVar6 + 0x10);
    pEVar4[3].mem = addr;
    pvVar6 = *(void **)((long)pvVar6 + 8);
    pEVar4[1].mem = pvVar6;
    pEVar4[2].size = local_138[0];
    pEVar4->size = local_17c;
    pEVar4[3].size = local_178;
    pEVar4[1].size = local_178;
  }
  else {
    local_17c = (int)((double)local_15c * (double)local_170);
    if (lwork == 0) {
      Glu->MemModel = SYSTEM;
    }
    else {
      if (lwork == -1) {
        return (panel_size * 0x18 + 0x2c) * local_174 + n * 0x15 + local_17c * 0x28 + 0x14;
      }
      if (0 < lwork) {
        Glu->MemModel = USER;
        (Glu->stack).used = 0;
        (Glu->stack).top1 = 0;
        (Glu->stack).top2 = lwork & 0x7ffffffcU;
        (Glu->stack).size = lwork & 0x7ffffffcU;
        (Glu->stack).array = work;
      }
    }
    local_178 = local_17c;
    local_138[0] = local_17c;
    if (Glu->MemModel == SYSTEM) {
      iVar2 = n + 1;
      local_170 = int32Malloc(iVar2);
      local_148 = int32Malloc(iVar2);
      local_150 = intMalloc(iVar2);
      local_158 = intMalloc(iVar2);
      local_168 = intMalloc(iVar2);
    }
    else {
      iVar1 = n * 4 + 4;
      iVar8 = (Glu->stack).used + iVar1;
      iVar2 = (Glu->stack).size;
      if (iVar8 < iVar2) {
        iVar3 = (Glu->stack).top1;
        local_170 = (int *)((long)iVar3 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar3 + iVar1;
        (Glu->stack).used = iVar8;
      }
      else {
        local_170 = (int *)0x0;
      }
      iVar8 = (Glu->stack).used + iVar1;
      if (iVar8 < iVar2) {
        iVar3 = (Glu->stack).top1;
        local_148 = (int *)((long)iVar3 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar3 + iVar1;
        (Glu->stack).used = iVar8;
      }
      else {
        local_148 = (int *)0x0;
      }
      iVar8 = (Glu->stack).used + iVar1;
      if (iVar8 < iVar2) {
        iVar3 = (Glu->stack).top1;
        local_150 = (int_t *)((long)iVar3 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar3 + iVar1;
        (Glu->stack).used = iVar8;
      }
      else {
        local_150 = (int_t *)0x0;
      }
      iVar8 = (Glu->stack).used + iVar1;
      if (iVar8 < iVar2) {
        iVar3 = (Glu->stack).top1;
        local_158 = (int_t *)((long)iVar3 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar3 + iVar1;
        (Glu->stack).used = iVar8;
      }
      else {
        local_158 = (int_t *)0x0;
      }
      iVar8 = (Glu->stack).used + iVar1;
      if (iVar8 < iVar2) {
        iVar2 = (Glu->stack).top1;
        local_168 = (int_t *)((long)iVar2 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar1 + iVar2;
        (Glu->stack).used = iVar8;
      }
      else {
        local_168 = (int_t *)0x0;
      }
    }
    pvVar5 = zexpand(&local_17c,LUSUP,0,0,Glu);
    pvVar6 = zexpand(&local_178,UCOL,0,0,Glu);
    piVar7 = (int_t *)zexpand(local_138,LSUB,0,0,Glu);
    addr = (int_t *)zexpand(&local_178,USUB,0,1,Glu);
    if ((addr == (int_t *)0x0 || piVar7 == (int_t *)0x0) ||
        (pvVar6 == (void *)0x0 || pvVar5 == (void *)0x0)) {
      do {
        if (Glu->MemModel == SYSTEM) {
          superlu_free(pvVar5);
          superlu_free(pvVar6);
          superlu_free(piVar7);
          superlu_free(addr);
        }
        else {
          iVar2 = local_17c * 0x10 + local_178 * 0x14 + local_138[0] * 4;
          piVar7 = &(Glu->stack).top1;
          *piVar7 = *piVar7 - iVar2;
          piVar7 = &(Glu->stack).used;
          *piVar7 = *piVar7 - iVar2;
        }
        iVar2 = local_17c / 2;
        iVar1 = local_178 / 2;
        iVar8 = local_138[0] / 2;
        local_17c = iVar2;
        local_178 = iVar1;
        local_138[0] = iVar8;
        if (iVar2 < local_15c) {
          puts("Not enough memory to perform factorization.");
          return (int)local_140 * 0x29 + iVar2 * 0x10 + iVar1 * 0x14 + iVar8 * 4;
        }
        pvVar5 = zexpand(&local_17c,LUSUP,0,0,Glu);
        pvVar6 = zexpand(&local_178,UCOL,0,0,Glu);
        piVar7 = (int_t *)zexpand(local_138,LSUB,0,0,Glu);
        addr = (int_t *)zexpand(&local_178,USUB,0,1,Glu);
      } while ((addr == (int_t *)0x0 || piVar7 == (int_t *)0x0) ||
               (pvVar6 == (void *)0x0 || pvVar5 == (void *)0x0));
    }
  }
  iVar8 = local_138[0];
  iVar1 = local_178;
  iVar2 = local_17c;
  Glu->xsup = local_170;
  Glu->supno = local_148;
  Glu->lsub = piVar7;
  Glu->xlsub = local_150;
  Glu->lusup = pvVar5;
  Glu->xlusup = local_158;
  Glu->ucol = pvVar6;
  Glu->usub = addr;
  Glu->xusub = local_168;
  Glu->nzlmax = local_138[0];
  Glu->nzumax = local_178;
  Glu->nzlumax = local_17c;
  n_00 = (int)local_140;
  iVar3 = zLUWorkInit(local_174,n_00,panel_size,iwork,dwork,Glu);
  if (iVar3 == 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
    iVar9 = 0;
  }
  else {
    iVar9 = iVar2 * 0x10 + iVar3 + n_00 * 0x29 + iVar8 * 4 + iVar1 * 0x14;
  }
  return iVar9;
}

Assistant:

int_t
zLUMemInit(fact_t fact, void *work, int_t lwork, int m, int n, int_t annz,
	  int panel_size, double fill_ratio, SuperMatrix *L, SuperMatrix *U,
          GlobalLU_t *Glu, int **iwork, doublecomplex **dwork)
{
    int      info, iword, dword;
    SCformat *Lstore;
    NCformat *Ustore;
    int      *xsup, *supno;
    int_t    *lsub, *xlsub;
    doublecomplex   *lusup;
    int_t    *xlusup;
    doublecomplex   *ucol;
    int_t    *usub, *xusub;
    int_t    nzlmax, nzumax, nzlumax;
    
    iword     = sizeof(int);
    dword     = sizeof(doublecomplex);
    Glu->n    = n;
    Glu->num_expansions = 0;

    Glu->expanders = (ExpHeader *) SUPERLU_MALLOC( NO_MEMTYPE *
                                                     sizeof(ExpHeader) );
    if ( !Glu->expanders ) ABORT("SUPERLU_MALLOC fails for expanders");
    
    if ( fact != SamePattern_SameRowPerm ) {
	/* Guess for L\U factors */
	nzumax = nzlumax = nzlmax = fill_ratio * annz;
	//nzlmax = SUPERLU_MAX(1, fill_ratio/4.) * annz;

	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else {
	    zSetupSpace(work, lwork, Glu);
	}
	
#if ( PRNTlevel >= 1 )
	printf("zLUMemInit() called: fill_ratio %.0f, nzlmax %lld, nzumax %lld\n", 
	       fill_ratio, (long long) nzlmax, (long long) nzumax);
	fflush(stdout);
#endif	
	
	/* Integer pointers for L\U factors */
	if ( Glu->MemModel == SYSTEM ) {
	    xsup   = int32Malloc(n+1);
	    supno  = int32Malloc(n+1);
	    xlsub  = intMalloc(n+1);
	    xlusup = intMalloc(n+1);
	    xusub  = intMalloc(n+1);
	} else {
	    xsup   = (int *)zuser_malloc((n+1) * iword, HEAD, Glu);
	    supno  = (int *)zuser_malloc((n+1) * iword, HEAD, Glu);
	    xlsub  = zuser_malloc((n+1) * iword, HEAD, Glu);
	    xlusup = zuser_malloc((n+1) * iword, HEAD, Glu);
	    xusub  = zuser_malloc((n+1) * iword, HEAD, Glu);
	}

	lusup = (doublecomplex *) zexpand( &nzlumax, LUSUP, 0, 0, Glu );
	ucol  = (doublecomplex *) zexpand( &nzumax, UCOL, 0, 0, Glu );
	lsub  = (int_t *) zexpand( &nzlmax, LSUB, 0, 0, Glu );
	usub  = (int_t *) zexpand( &nzumax, USUB, 0, 1, Glu );

	while ( !lusup || !ucol || !lsub || !usub ) {
	    if ( Glu->MemModel == SYSTEM ) {
		SUPERLU_FREE(lusup); 
		SUPERLU_FREE(ucol); 
		SUPERLU_FREE(lsub); 
		SUPERLU_FREE(usub);
	    } else {
		zuser_free((nzlumax+nzumax)*dword+(nzlmax+nzumax)*iword,
                            HEAD, Glu);
	    }
	    nzlumax /= 2;
	    nzumax /= 2;
	    nzlmax /= 2;
	    if ( nzlumax < annz ) {
		printf("Not enough memory to perform factorization.\n");
		return (zmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
	    }
#if ( PRNTlevel >= 1)
	    printf("zLUMemInit() reduce size: nzlmax %ld, nzumax %ld\n", 
		   (long) nzlmax, (long) nzumax);
	    fflush(stdout);
#endif
	    lusup = (doublecomplex *) zexpand( &nzlumax, LUSUP, 0, 0, Glu );
	    ucol  = (doublecomplex *) zexpand( &nzumax, UCOL, 0, 0, Glu );
	    lsub  = (int_t *) zexpand( &nzlmax, LSUB, 0, 0, Glu );
	    usub  = (int_t *) zexpand( &nzumax, USUB, 0, 1, Glu );
	}
	
    } else {
	/* fact == SamePattern_SameRowPerm */
	Lstore   = L->Store;
	Ustore   = U->Store;
	xsup     = Lstore->sup_to_col;
	supno    = Lstore->col_to_sup;
	xlsub    = Lstore->rowind_colptr;
	xlusup   = Lstore->nzval_colptr;
	xusub    = Ustore->colptr;
	nzlmax   = Glu->nzlmax;    /* max from previous factorization */
	nzumax   = Glu->nzumax;
	nzlumax  = Glu->nzlumax;
	
	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else if ( lwork == 0 ) {
	    Glu->MemModel = SYSTEM;
	} else {
	    Glu->MemModel = USER;
	    Glu->stack.top2 = (lwork/4)*4; /* must be word-addressable */
	    Glu->stack.size = Glu->stack.top2;
	}
	
	lsub  = Glu->expanders[LSUB].mem  = Lstore->rowind;
	lusup = Glu->expanders[LUSUP].mem = Lstore->nzval;
	usub  = Glu->expanders[USUB].mem  = Ustore->rowind;
	ucol  = Glu->expanders[UCOL].mem  = Ustore->nzval;;
	Glu->expanders[LSUB].size         = nzlmax;
	Glu->expanders[LUSUP].size        = nzlumax;
	Glu->expanders[USUB].size         = nzumax;
	Glu->expanders[UCOL].size         = nzumax;	
    }

    Glu->xsup    = xsup;
    Glu->supno   = supno;
    Glu->lsub    = lsub;
    Glu->xlsub   = xlsub;
    Glu->lusup   = (void *) lusup;
    Glu->xlusup  = xlusup;
    Glu->ucol    = (void *) ucol;
    Glu->usub    = usub;
    Glu->xusub   = xusub;
    Glu->nzlmax  = nzlmax;
    Glu->nzumax  = nzumax;
    Glu->nzlumax = nzlumax;
    
    info = zLUWorkInit(m, n, panel_size, iwork, dwork, Glu);
    if ( info )
	return ( info + zmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
    
    ++Glu->num_expansions;
    return 0;
    
}